

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O0

void __thiscall
cppforth::Forth::split_str
          (Forth *this,string *str,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokens,string *delimiters)

{
  string *psVar1;
  size_type sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  size_type local_40;
  size_type lastPos;
  size_type pos;
  size_type delimitersSize;
  string *delimiters_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokens_local;
  string *str_local;
  Forth *this_local;
  
  delimitersSize = (size_type)delimiters;
  delimiters_local = (string *)tokens;
  tokens_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)str;
  str_local = (string *)this;
  pos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
                  (delimiters);
  lastPos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       tokens_local,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       delimitersSize,0);
  local_40 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        tokens_local,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        delimitersSize,lastPos + pos);
  psVar1 = delimiters_local;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
            (&local_60,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tokens_local,0,
             lastPos);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)psVar1,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  while( true ) {
    sVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            find_first_not_of((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              tokens_local,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              delimitersSize,lastPos);
    psVar1 = delimiters_local;
    if (sVar2 == 0xffffffffffffffff) break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tokens_local,
               lastPos + pos,(local_40 - lastPos) - pos);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)psVar1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    lastPos = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         tokens_local,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         delimitersSize,local_40);
    local_40 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::find
                         ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          tokens_local,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          delimitersSize,lastPos + pos);
  }
  return;
}

Assistant:

void split_str(const std::string& str, std::vector<std::string>& tokens, const std::string& delimiters)
		{
			std::string::size_type delimitersSize = delimiters.size();
			std::string::size_type pos = str.find(delimiters, 0);
			std::string::size_type lastPos = str.find(delimiters, pos + delimitersSize);
			tokens.push_back(str.substr(0, pos));

			while (str.find_first_not_of(delimiters, pos) != std::wstring::npos)
			{
				tokens.push_back(str.substr(pos + delimitersSize, lastPos - pos - delimitersSize));
				pos = str.find(delimiters, lastPos);
				lastPos = str.find(delimiters, pos + delimitersSize);
			}
		}